

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O3

MPP_RET mpp_dec_set_cfg(MppDecCfgSet *dst,MppDecCfgSet *src)

{
  ulong uVar1;
  MppExtCbCtx pvVar2;
  uint uVar3;
  
  uVar1 = (src->base).change;
  if (uVar1 != 0) {
    if ((uVar1 & 1) != 0) {
      (dst->base).type = (src->base).type;
    }
    if ((uVar1 & 2) != 0) {
      (dst->base).coding = (src->base).coding;
    }
    if ((uVar1 & 4) != 0) {
      (dst->base).hw_type = (src->base).hw_type;
    }
    if ((uVar1 & 8) != 0) {
      (dst->base).batch_mode = (src->base).batch_mode;
    }
    uVar3 = (uint)uVar1;
    if ((uVar3 >> 8 & 1) != 0) {
      (dst->base).out_fmt = (src->base).out_fmt;
    }
    if ((uVar3 >> 9 & 1) != 0) {
      (dst->base).fast_out = (src->base).fast_out;
    }
    if ((uVar3 >> 10 & 1) != 0) {
      (dst->base).fast_parse = (src->base).fast_parse;
    }
    if ((uVar3 >> 0xb & 1) != 0) {
      (dst->base).split_parse = (src->base).split_parse;
    }
    if ((uVar3 >> 0xc & 1) != 0) {
      (dst->base).internal_pts = (src->base).internal_pts;
    }
    if ((uVar3 >> 0xd & 1) != 0) {
      (dst->base).sort_pts = (src->base).sort_pts;
    }
    if ((uVar3 >> 0xe & 1) != 0) {
      (dst->base).disable_error = (src->base).disable_error;
    }
    if ((uVar3 >> 0x1e & 1) != 0) {
      (dst->base).dis_err_clr_mark = (src->base).dis_err_clr_mark;
    }
    if ((short)uVar1 < 0) {
      (dst->base).enable_vproc = (src->base).enable_vproc;
    }
    if ((uVar3 >> 0x10 & 1) != 0) {
      (dst->base).enable_fast_play = (src->base).enable_fast_play;
    }
    if ((uVar3 >> 0x11 & 1) != 0) {
      (dst->base).enable_hdr_meta = (src->base).enable_hdr_meta;
    }
    if ((uVar3 >> 0x12 & 1) != 0) {
      (dst->base).enable_thumbnail = (src->base).enable_thumbnail;
    }
    if ((uVar3 >> 0x13 & 1) != 0) {
      (dst->base).enable_mvc = (src->base).enable_mvc;
    }
    if ((uVar3 >> 0x14 & 1) != 0) {
      (dst->base).disable_dpb_chk = (src->base).disable_dpb_chk;
    }
    if ((uVar3 >> 0x1c & 1) != 0) {
      (dst->base).disable_thread = (src->base).disable_thread;
    }
    if ((uVar3 >> 0x1d & 1) != 0) {
      (dst->base).codec_mode = (src->base).codec_mode;
    }
    (dst->base).change = uVar1 & 0xffffffff;
    (src->base).change = 0;
  }
  uVar1 = (src->cb).change;
  if (uVar1 != 0) {
    if ((uVar1 & 1) != 0) {
      pvVar2 = (src->cb).pkt_rdy_ctx;
      (dst->cb).pkt_rdy_cb = (src->cb).pkt_rdy_cb;
      (dst->cb).pkt_rdy_ctx = pvVar2;
      (dst->cb).pkt_rdy_cmd = (src->cb).pkt_rdy_cmd;
    }
    if ((uVar1 & 2) != 0) {
      pvVar2 = (src->cb).frm_rdy_ctx;
      (dst->cb).frm_rdy_cb = (src->cb).frm_rdy_cb;
      (dst->cb).frm_rdy_ctx = pvVar2;
      (dst->cb).frm_rdy_cmd = (src->cb).frm_rdy_cmd;
    }
    (dst->cb).change = uVar1 & 0xffffffff;
    (src->cb).change = 0;
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_dec_set_cfg(MppDecCfgSet *dst, MppDecCfgSet *src)
{
    MppDecBaseCfg *src_base = &src->base;
    MppDecCbCfg *src_cb = &src->cb;

    if (src_base->change) {
        MppDecBaseCfg *dst_base = &dst->base;
        RK_U32 change = src_base->change;

        if (change & MPP_DEC_CFG_CHANGE_TYPE)
            dst_base->type = src_base->type;

        if (change & MPP_DEC_CFG_CHANGE_CODING)
            dst_base->coding = src_base->coding;

        if (change & MPP_DEC_CFG_CHANGE_HW_TYPE)
            dst_base->hw_type = src_base->hw_type;

        if (change & MPP_DEC_CFG_CHANGE_BATCH_MODE)
            dst_base->batch_mode = src_base->batch_mode;

        if (change & MPP_DEC_CFG_CHANGE_OUTPUT_FORMAT)
            dst_base->out_fmt = src_base->out_fmt;

        if (change & MPP_DEC_CFG_CHANGE_FAST_OUT)
            dst_base->fast_out = src_base->fast_out;

        if (change & MPP_DEC_CFG_CHANGE_FAST_PARSE)
            dst_base->fast_parse = src_base->fast_parse;

        if (change & MPP_DEC_CFG_CHANGE_SPLIT_PARSE)
            dst_base->split_parse = src_base->split_parse;

        if (change & MPP_DEC_CFG_CHANGE_INTERNAL_PTS)
            dst_base->internal_pts = src_base->internal_pts;

        if (change & MPP_DEC_CFG_CHANGE_SORT_PTS)
            dst_base->sort_pts = src_base->sort_pts;

        if (change & MPP_DEC_CFG_CHANGE_DISABLE_ERROR)
            dst_base->disable_error = src_base->disable_error;

        if (change & MPP_DEC_CFG_CHANGE_DIS_ERR_CLR_MARK)
            dst_base->dis_err_clr_mark = src_base->dis_err_clr_mark;

        if (change & MPP_DEC_CFG_CHANGE_ENABLE_VPROC)
            dst_base->enable_vproc = src_base->enable_vproc;

        if (change & MPP_DEC_CFG_CHANGE_ENABLE_FAST_PLAY)
            dst_base->enable_fast_play = src_base->enable_fast_play;

        if (change & MPP_DEC_CFG_CHANGE_ENABLE_HDR_META)
            dst_base->enable_hdr_meta = src_base->enable_hdr_meta;

        if (change & MPP_DEC_CFG_CHANGE_ENABLE_THUMBNAIL)
            dst_base->enable_thumbnail = src_base->enable_thumbnail;

        if (change & MPP_DEC_CFG_CHANGE_ENABLE_MVC)
            dst_base->enable_mvc = src_base->enable_mvc;

        if (change & MPP_DEC_CFG_CHANGE_DISABLE_DPB_CHECK)
            dst_base->disable_dpb_chk = src_base->disable_dpb_chk;

        if (change & MPP_DEC_CFG_CHANGE_DISABLE_THREAD)
            dst_base->disable_thread = src_base->disable_thread;

        if (change & MPP_DEC_CFG_CHANGE_CODEC_MODE)
            dst_base->codec_mode = src_base->codec_mode;

        dst_base->change = change;
        src_base->change = 0;
    }

    if (src_cb->change) {
        MppDecCbCfg *dst_cb = &dst->cb;
        RK_U32 change = src_cb->change;

        if (change & MPP_DEC_CB_CFG_CHANGE_PKT_RDY) {
            dst_cb->pkt_rdy_cb = src_cb->pkt_rdy_cb;
            dst_cb->pkt_rdy_ctx = src_cb->pkt_rdy_ctx;
            dst_cb->pkt_rdy_cmd = src_cb->pkt_rdy_cmd;
        }

        if (change & MPP_DEC_CB_CFG_CHANGE_FRM_RDY) {
            dst_cb->frm_rdy_cb = src_cb->frm_rdy_cb;
            dst_cb->frm_rdy_ctx = src_cb->frm_rdy_ctx;
            dst_cb->frm_rdy_cmd = src_cb->frm_rdy_cmd;
        }

        dst_cb->change = change;
        src_cb->change = 0;
    }

    return MPP_OK;
}